

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseConvertNetwork(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,int fMapped)

{
  Abc_NtkFunc_t AVar1;
  void *pvVar2;
  
  AVar1 = pNtk->ntkFunc;
  if (fMapped == 0) {
    if (AVar1 == ABC_FUNC_AIG) {
      return 1;
    }
    if (AVar1 != ABC_FUNC_BLACKBOX) goto LAB_002eb030;
    if (pNtk->pManFunc != (void *)0x0) {
      __assert_fail("pNtk->pManFunc == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                    ,0x178,"int Ver_ParseConvertNetwork(Ver_Man_t *, Abc_Ntk_t *, int)");
    }
    pNtk->ntkFunc = ABC_FUNC_AIG;
    pvVar2 = pMan->pDesign->pManFunc;
  }
  else {
    if (AVar1 == ABC_FUNC_MAP) {
      return 1;
    }
    if (AVar1 != ABC_FUNC_BLACKBOX) {
LAB_002eb030:
      sprintf(pMan->sError,
              "The network %s appears to have both gates and assign statements. Currently such network are not allowed. One way to fix this problem might be to replace assigns by buffers from the library."
              ,pNtk->pName);
      Ver_ParsePrintErrorMessage(pMan);
      return 0;
    }
    if (pNtk->pManFunc != (void *)0x0) {
      __assert_fail("pNtk->pManFunc == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                    ,0x167,"int Ver_ParseConvertNetwork(Ver_Man_t *, Abc_Ntk_t *, int)");
    }
    pNtk->ntkFunc = ABC_FUNC_MAP;
    pvVar2 = pMan->pDesign->pGenlib;
  }
  pNtk->pManFunc = pvVar2;
  return 1;
}

Assistant:

int Ver_ParseConvertNetwork( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, int fMapped )
{
    if ( fMapped )
    {
        // convert from the blackbox into the network with local functions representated by AIGs
        if ( pNtk->ntkFunc == ABC_FUNC_BLACKBOX )
        {
            // change network type
            assert( pNtk->pManFunc == NULL );
            pNtk->ntkFunc = ABC_FUNC_MAP;
            pNtk->pManFunc = pMan->pDesign->pGenlib;
        }
        else if ( pNtk->ntkFunc != ABC_FUNC_MAP )
        {
            sprintf( pMan->sError, "The network %s appears to have both gates and assign statements. Currently such network are not allowed. One way to fix this problem might be to replace assigns by buffers from the library.", pNtk->pName );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
    }
    else
    {
        // convert from the blackbox into the network with local functions representated by AIGs
        if ( pNtk->ntkFunc == ABC_FUNC_BLACKBOX )
        {
            // change network type
            assert( pNtk->pManFunc == NULL );
            pNtk->ntkFunc = ABC_FUNC_AIG;
            pNtk->pManFunc = pMan->pDesign->pManFunc;
        }
        else if ( pNtk->ntkFunc != ABC_FUNC_AIG )
        {
            sprintf( pMan->sError, "The network %s appears to have both gates and assign statements. Currently such network are not allowed. One way to fix this problem might be to replace assigns by buffers from the library.", pNtk->pName );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
    }
    return 1;
}